

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::IsObjectArrayFrozen
          (ES5ArrayTypeHandlerBase<int> *this,ES5Array *arr)

{
  byte bVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  uint32 index_00;
  IndexPropertyDescriptorMap *pIVar5;
  IndexPropertyDescriptor *pIVar6;
  IndexPropertyDescriptor *descriptor;
  uint32 index;
  int i;
  ES5Array *arr_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  BVar3 = DictionaryTypeHandlerBase<int>::IsFrozen
                    (&this->super_DictionaryTypeHandlerBase<int>,(DynamicObject *)arr);
  if (BVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    descriptor._4_4_ = 0;
    while( true ) {
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      iVar4 = IndexPropertyDescriptorMap::Count(pIVar5);
      if (iVar4 <= descriptor._4_4_) break;
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      index_00 = IndexPropertyDescriptorMap::GetKeyAt(pIVar5,descriptor._4_4_);
      pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                         (&this->indexPropertyMap);
      pIVar6 = IndexPropertyDescriptorMap::GetReferenceAt(pIVar5,descriptor._4_4_);
      if ((pIVar6->Attributes & 8) == 0) {
        if ((pIVar6->Attributes & 2) != 0) {
          return 0;
        }
        if (((pIVar6->Attributes & 4) != 0) && (BVar3 = HasDataItem(this,arr,index_00), BVar3 != 0))
        {
          return 0;
        }
      }
      descriptor._4_4_ = descriptor._4_4_ + 1;
    }
    bVar1 = GetDataItemAttributes(this);
    if (((bVar1 & 6) == 0) || (bVar2 = HasAnyDataItemNotInMap(this,arr), !bVar2)) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::IsObjectArrayFrozen(ES5Array* arr)
    {
        if (!__super::IsFrozen(arr))
        {
            return false;
        }

        for (int i = 0; i < indexPropertyMap->Count(); i++)
        {
            uint32 index = indexPropertyMap->GetKeyAt(i);
            IndexPropertyDescriptor* descriptor = indexPropertyMap->GetReferenceAt(i);

            if (descriptor->Attributes & PropertyDeleted)
            {
                continue; // Skip deleted
            }
            if (descriptor->Attributes & PropertyConfigurable)
            {
                return false;
            }

            if ((descriptor->Attributes & PropertyWritable) && HasDataItem(arr, index))
            {
                //Only data descriptor has Writable property
                return false;
            }
        }

        // Check data item not in map
        if (this->GetDataItemAttributes() & (PropertyWritable | PropertyConfigurable))
        {
            if (HasAnyDataItemNotInMap(arr))
            {
                return false;
            }
        }

        return true;
    }